

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer-real-time.cpp
# Opt level: O0

void __thiscall dynamicgraph::TracerRealTime::display(TracerRealTime *this,ostream *os)

{
  long lVar1;
  bool bVar2;
  _Setw _Var3;
  _Setprecision _Var4;
  ostream *poVar5;
  reference ppbVar6;
  reference ppSVar7;
  string *psVar8;
  long lVar9;
  streamsize __prec;
  char *pcVar10;
  long local_b0;
  allocator<char> local_79;
  string local_78 [8];
  string unit;
  uint dec;
  streamsize MSIZE;
  streamsize SIZE;
  streamsize PRECISION;
  OutStringStream *file;
  _Self local_28;
  const_iterator iter;
  const_iterator iterFile;
  ostream *os_local;
  TracerRealTime *this_local;
  
  poVar5 = std::operator<<(os,(string *)&CLASS_NAME_abi_cxx11_);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = std::operator<<(poVar5,(string *)&this->field_0x8);
  poVar5 = std::operator<<(poVar5," [mode=");
  pcVar10 = "pause";
  if ((this->field_0x1c0 & 1) != 0) {
    pcVar10 = "play";
  }
  poVar5 = std::operator<<(poVar5,pcVar10);
  poVar5 = std::operator<<(poVar5,"] : ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<(poVar5,"  - Dep list: ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  iter._M_node = (_List_node_base *)
                 std::__cxx11::
                 list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                 ::begin((list<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
                          *)&this->field_0x190);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
       ::begin((list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
                *)&this->field_0xd8);
  while( true ) {
    file = (OutStringStream *)
           std::__cxx11::
           list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
           ::end((list<const_dynamicgraph::SignalBase<int>_*,_std::allocator<const_dynamicgraph::SignalBase<int>_*>_>
                  *)&this->field_0xd8);
    bVar2 = std::operator!=((_Self *)&file,&local_28);
    if (!bVar2) break;
    ppbVar6 = std::_List_const_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*>::
              operator*((_List_const_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*> *
                        )&iter);
    if (*ppbVar6 == (basic_ostream<char,_std::char_traits<char>_> *)0x0) {
      local_b0 = 0;
    }
    else {
      local_b0 = __dynamic_cast(*ppbVar6,&std::ostream::typeinfo,&OutStringStream::typeinfo,0);
    }
    poVar5 = std::operator<<(os,"     -> ");
    ppSVar7 = std::_List_const_iterator<const_dynamicgraph::SignalBase<int>_*>::operator*(&local_28)
    ;
    psVar8 = SignalBase<int>::getName_abi_cxx11_(*ppSVar7);
    std::operator<<(poVar5,(string *)psVar8);
    lVar9 = std::__cxx11::string::length();
    if (lVar9 != 0) {
      poVar5 = std::operator<<(os," (in ");
      poVar5 = std::operator<<(poVar5,(string *)(local_b0 + 0x90));
      std::operator<<(poVar5,")");
    }
    std::operator<<(os,"\t");
    if (local_b0 != 0) {
      __prec = std::ios_base::precision
                         ((ios_base *)
                          ((long)&os->_vptr_basic_ostream + (long)os->_vptr_basic_ostream[-3]));
      lVar9 = *(long *)(local_b0 + 0x78);
      lVar1 = *(long *)(local_b0 + 0x80);
      unit.field_2._12_4_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_78,"",&local_79);
      std::allocator<char>::~allocator(&local_79);
      if ((lVar9 >> 0x1e == 0) && (lVar1 >> 0x1e == 0)) {
        if ((lVar9 >> 0x14 == 0) && (lVar1 >> 0x14 == 0)) {
          if ((lVar9 >> 10 != 0) || (lVar1 >> 10 != 0)) {
            unit.field_2._12_4_ = 10;
            std::__cxx11::string::operator=(local_78,"Ko");
          }
        }
        else {
          unit.field_2._12_4_ = 0x14;
          std::__cxx11::string::operator=(local_78,"Mo");
        }
      }
      else {
        unit.field_2._12_4_ = 0x1e;
        std::__cxx11::string::operator=(local_78,"Go");
      }
      poVar5 = std::operator<<(os,"[");
      _Var3 = std::setw(1);
      poVar5 = std::operator<<(poVar5,_Var3);
      _Var4 = std::setprecision(1);
      poVar5 = std::operator<<(poVar5,_Var4);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,((double)lVar9 + 0.0) /
                                 (double)(1 << (unit.field_2._M_local_buf[0xc] & 0x1fU)));
      poVar5 = std::operator<<(poVar5,local_78);
      poVar5 = std::operator<<(poVar5,"/");
      _Var4 = std::setprecision(2);
      poVar5 = std::operator<<(poVar5,_Var4);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,((double)lVar1 + 0.0) /
                                 (double)(1 << (unit.field_2._M_local_buf[0xc] & 0x1fU)));
      poVar5 = std::operator<<(poVar5,local_78);
      std::operator<<(poVar5,"]\t");
      if ((*(byte *)(local_b0 + 0x88) & 1) != 0) {
        std::operator<<(os,"(FULL)");
      }
      std::ios_base::precision
                ((ios_base *)((long)&os->_vptr_basic_ostream + (long)os->_vptr_basic_ostream[-3]),
                 __prec);
      std::__cxx11::string::~string(local_78);
    }
    std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    std::_List_const_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*>::operator++
              ((_List_const_iterator<std::basic_ostream<char,_std::char_traits<char>_>_*> *)&iter);
    std::_List_const_iterator<const_dynamicgraph::SignalBase<int>_*>::operator++(&local_28);
  }
  return;
}

Assistant:

void TracerRealTime::display(std::ostream &os) const {
  os << CLASS_NAME << " " << name << " [mode=" << (play ? "play" : "pause")
     << "] : " << endl
     << "  - Dep list: " << endl;

  FileList::const_iterator iterFile = files.begin();
  for (SignalList::const_iterator iter = toTraceSignals.begin();
       toTraceSignals.end() != iter; ++iter) {
    dgDEBUG(35) << "Next" << endl;
    const OutStringStream *file = dynamic_cast<OutStringStream *>(*iterFile);
    os << "     -> " << (*iter)->getName();
    if (file->givenname.length()) os << " (in " << file->givenname << ")";
    os << "\t";
    if (file) {
      const std::streamsize PRECISION = os.precision();
      const std::streamsize SIZE = file->index;
      const std::streamsize MSIZE = file->bufferSize;
      unsigned int dec = 0;
      std::string unit = "";
      if ((SIZE >> 30) || (MSIZE >> 30)) {
        dec = 30;
        unit = "Go";
      } else if ((SIZE >> 20) || (MSIZE >> 20)) {
        dec = 20;
        unit = "Mo";
      } else if ((SIZE >> 10) || (MSIZE >> 10)) {
        dec = 10;
        unit = "Ko";
      }
      os << "[" << std::setw(1) << std::setprecision(1)
         << (((double)SIZE + 0.0) / (1 << dec)) << unit << "/"
         << std::setprecision(2) << (((double)MSIZE + 0.0) / (1 << dec)) << unit
         << "]\t";
      if (file->full) os << "(FULL)";
      os.precision(PRECISION);
    }
    os << endl;
    ++iterFile;
  }
}